

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::FindPackageStackRAII::~FindPackageStackRAII(FindPackageStackRAII *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmFindPackageCall *pcVar3;
  cmFindPackageCall top;
  __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_70;
  cmFindPackageCall local_60;
  cmFindPackageCall local_38;
  
  pcVar3 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                     (&(this->Makefile->FindPackageStack).
                       super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  this->Makefile->FindPackageStackNextIndex = pcVar3->Index + 1;
  cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Pop
            ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_60);
  std::
  __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&this->Makefile->FindPackageStack,
              (__shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.Name._M_string_length);
  bVar2 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Empty
                    (&(this->Makefile->FindPackageStack).
                      super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
  if (!bVar2) {
    pcVar3 = cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Top
                       (&(this->Makefile->FindPackageStack).
                         super_cmConstStack<cmFindPackageCall,_cmFindPackageStack>);
    cmFindPackageCall::cmFindPackageCall(&local_60,pcVar3);
    cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Pop
              ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_70);
    std::
    __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&this->Makefile->FindPackageStack,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    pcVar1 = this->Makefile;
    local_60.Index = pcVar1->FindPackageStackNextIndex;
    pcVar1->FindPackageStackNextIndex = local_60.Index + 1;
    cmFindPackageCall::cmFindPackageCall(&local_38,&local_60);
    cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Push
              ((cmConstStack<cmFindPackageCall,_cmFindPackageStack> *)&local_70,
               (cmFindPackageCall *)&pcVar1->FindPackageStack);
    std::
    __shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<const_cmConstStack<cmFindPackageCall,_cmFindPackageStack>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&this->Makefile->FindPackageStack,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

cmMakefile::FindPackageStackRAII::~FindPackageStackRAII()
{
  this->Makefile->FindPackageStackNextIndex =
    this->Makefile->FindPackageStack.Top().Index + 1;
  this->Makefile->FindPackageStack = this->Makefile->FindPackageStack.Pop();

  if (!this->Makefile->FindPackageStack.Empty()) {
    auto top = this->Makefile->FindPackageStack.Top();
    this->Makefile->FindPackageStack = this->Makefile->FindPackageStack.Pop();

    top.Index = this->Makefile->FindPackageStackNextIndex;
    this->Makefile->FindPackageStackNextIndex++;

    this->Makefile->FindPackageStack =
      this->Makefile->FindPackageStack.Push(top);
  }
}